

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConstraintDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConstraintDeclarationSyntax,slang::syntax::ConstraintDeclarationSyntax_const&>
          (BumpAllocator *this,ConstraintDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  ConstraintBlockSyntax *pCVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  ConstraintDeclarationSyntax *pCVar9;
  
  pCVar9 = (ConstraintDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConstraintDeclarationSyntax *)this->endPtr < pCVar9 + 1) {
    pCVar9 = (ConstraintDeclarationSyntax *)allocateSlow(this,0xe0,8);
  }
  else {
    this->head->current = (byte *)(pCVar9 + 1);
  }
  (pCVar9->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pCVar9->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar9->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pCVar9->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00c8c940;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar9->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar9->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00c8c880;
  uVar5 = *(undefined4 *)&(args->qualifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar9->qualifiers).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->qualifiers).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar9->qualifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pCVar9->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar9->qualifiers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->qualifiers).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar9->qualifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00c8c940;
  (pCVar9->qualifiers).super_SyntaxListBase.childCount =
       (args->qualifiers).super_SyntaxListBase.childCount;
  sVar2 = (args->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar9->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
  (pCVar9->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar9->qualifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00c94ef0;
  uVar6 = (args->keyword).field_0x2;
  NVar7.raw = (args->keyword).numFlags.raw;
  uVar8 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  (pCVar9->keyword).kind = (args->keyword).kind;
  (pCVar9->keyword).field_0x2 = uVar6;
  (pCVar9->keyword).numFlags = (NumericTokenFlags)NVar7.raw;
  (pCVar9->keyword).rawLen = uVar8;
  (pCVar9->keyword).info = pIVar3;
  uVar5 = *(undefined4 *)&(args->specifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->specifiers).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar9->specifiers).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->specifiers).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar9->specifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pCVar9->specifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar9->specifiers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->specifiers).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar9->specifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00c8c940;
  (pCVar9->specifiers).super_SyntaxListBase.childCount =
       (args->specifiers).super_SyntaxListBase.childCount;
  sVar2 = (args->specifiers).
          super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar9->specifiers).super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>.
  _M_ptr = (args->specifiers).
           super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar9->specifiers).super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar2;
  (pCVar9->specifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00c95248;
  pCVar4 = (args->block).ptr;
  (pCVar9->name).ptr = (args->name).ptr;
  (pCVar9->block).ptr = pCVar4;
  return pCVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }